

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

llb_buildengine_t * llb_buildengine_create(llb_buildengine_delegate_t delegate)

{
  llb_buildengine_delegate_t delegate_00;
  CAPIBuildEngine *this;
  CAPIBuildEngineDelegate *this_00;
  BuildEngine *this_01;
  type delegate_01;
  unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_> local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  _func_void_void_ptr_llb_data_t_ptr_uint64_t *local_20;
  unique_ptr<llbuild::core::BuildEngineDelegate,_std::default_delete<llbuild::core::BuildEngineDelegate>_>
  local_18;
  CAPIBuildEngine *local_10;
  CAPIBuildEngine *capi_engine;
  
  this = (CAPIBuildEngine *)operator_new(0x10);
  anon_unknown.dwarf_1d5768::CAPIBuildEngine::CAPIBuildEngine(this);
  local_10 = this;
  this_00 = (CAPIBuildEngineDelegate *)operator_new(0x38);
  memcpy(&local_40,&stack0x00000008,0x28);
  delegate_00.destroy_context = (_func_void_void_ptr *)uStack_38;
  delegate_00.context = (void *)local_40;
  delegate_00.lookup_rule = (_func_void_void_ptr_llb_data_t_ptr_llb_rule_t_ptr *)local_30;
  delegate_00.error = (_func_void_void_ptr_char_ptr *)uStack_28;
  delegate_00.cycle_detected = local_20;
  anon_unknown.dwarf_1d5768::CAPIBuildEngineDelegate::CAPIBuildEngineDelegate(this_00,delegate_00);
  std::
  unique_ptr<llbuild::core::BuildEngineDelegate,std::default_delete<llbuild::core::BuildEngineDelegate>>
  ::unique_ptr<std::default_delete<llbuild::core::BuildEngineDelegate>,void>
            ((unique_ptr<llbuild::core::BuildEngineDelegate,std::default_delete<llbuild::core::BuildEngineDelegate>>
              *)&local_18,(pointer)this_00);
  std::
  unique_ptr<llbuild::core::BuildEngineDelegate,_std::default_delete<llbuild::core::BuildEngineDelegate>_>
  ::operator=(&local_10->delegate,&local_18);
  std::
  unique_ptr<llbuild::core::BuildEngineDelegate,_std::default_delete<llbuild::core::BuildEngineDelegate>_>
  ::~unique_ptr(&local_18);
  this_01 = (BuildEngine *)operator_new(8);
  delegate_01 = std::
                unique_ptr<llbuild::core::BuildEngineDelegate,_std::default_delete<llbuild::core::BuildEngineDelegate>_>
                ::operator*(&local_10->delegate);
  llbuild::core::BuildEngine::BuildEngine(this_01,delegate_01);
  std::unique_ptr<llbuild::core::BuildEngine,std::default_delete<llbuild::core::BuildEngine>>::
  unique_ptr<std::default_delete<llbuild::core::BuildEngine>,void>
            ((unique_ptr<llbuild::core::BuildEngine,std::default_delete<llbuild::core::BuildEngine>>
              *)&local_48,this_01);
  std::unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>::
  operator=(&local_10->engine,&local_48);
  std::unique_ptr<llbuild::core::BuildEngine,_std::default_delete<llbuild::core::BuildEngine>_>::
  ~unique_ptr(&local_48);
  return (llb_buildengine_t *)local_10;
}

Assistant:

llb_buildengine_t* llb_buildengine_create(llb_buildengine_delegate_t delegate) {
  CAPIBuildEngine* capi_engine = new CAPIBuildEngine;
  capi_engine->delegate = std::unique_ptr<BuildEngineDelegate>(
    new CAPIBuildEngineDelegate(delegate));
  capi_engine->engine = std::unique_ptr<BuildEngine>(
    new BuildEngine(*capi_engine->delegate));
  return (llb_buildengine_t*) capi_engine;
}